

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selftest.c
# Opt level: O0

int calloc_self_test(int verbose)

{
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  char *pcVar1;
  uintptr_t old_buffer1;
  void *buffer2;
  void *buffer1;
  void *empty2;
  void *empty1;
  int failures;
  int verbose_local;
  
  empty1._0_4_ = 0;
  __ptr = calloc(0,1);
  __ptr_00 = calloc(0,1);
  __ptr_01 = calloc(1,1);
  __ptr_02 = calloc(1,1);
  if ((__ptr == (void *)0x0) && (__ptr_00 == (void *)0x0)) {
    if (verbose != 0) {
      printf("  CALLOC(0): passed (NULL)\n");
    }
  }
  else if ((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) {
    if (verbose != 0) {
      printf("  CALLOC(0): failed (mix of NULL and non-NULL)\n");
    }
    empty1._0_4_ = 1;
  }
  else if (__ptr == __ptr_00) {
    if (verbose != 0) {
      printf("  CALLOC(0): passed (same non-null)\n");
    }
  }
  else if (verbose != 0) {
    printf("  CALLOC(0): passed (distinct non-null)\n");
  }
  if ((__ptr_01 == (void *)0x0) || (__ptr_02 == (void *)0x0)) {
    if (verbose != 0) {
      printf("  CALLOC(1): failed (NULL)\n");
    }
    empty1._0_4_ = (int)empty1 + 1;
  }
  else if (__ptr_01 == __ptr_02) {
    if (verbose != 0) {
      printf("  CALLOC(1): failed (same buffer twice)\n");
    }
    empty1._0_4_ = (int)empty1 + 1;
  }
  else if (verbose != 0) {
    printf("  CALLOC(1): passed\n");
  }
  free(__ptr_01);
  __ptr_03 = calloc(1,1);
  if (__ptr_03 == (void *)0x0) {
    if (verbose != 0) {
      printf("  CALLOC(1 again): failed (NULL)\n");
    }
    empty1._0_4_ = (int)empty1 + 1;
  }
  else if (verbose != 0) {
    pcVar1 = "different";
    if (__ptr_01 == __ptr_03) {
      pcVar1 = "same";
    }
    printf("  CALLOC(1 again): passed (%s address)\n",pcVar1);
  }
  if (verbose != 0) {
    printf(anon_var_dwarf_15405 + 8);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_03);
  free(__ptr_02);
  return (int)empty1;
}

Assistant:

static int calloc_self_test( int verbose )
{
    int failures = 0;
    void *empty1 = mbedtls_calloc( 0, 1 );
    void *empty2 = mbedtls_calloc( 0, 1 );
    void *buffer1 = mbedtls_calloc( 1, 1 );
    void *buffer2 = mbedtls_calloc( 1, 1 );
    uintptr_t old_buffer1;

    if( empty1 == NULL && empty2 == NULL )
    {
        if( verbose )
            mbedtls_printf( "  CALLOC(0): passed (NULL)\n" );
    }
    else if( empty1 == NULL || empty2 == NULL )
    {
        if( verbose )
            mbedtls_printf( "  CALLOC(0): failed (mix of NULL and non-NULL)\n" );
        ++failures;
    }
    else if( empty1 == empty2 )
    {
        if( verbose )
            mbedtls_printf( "  CALLOC(0): passed (same non-null)\n" );
    }
    else
    {
        if( verbose )
            mbedtls_printf( "  CALLOC(0): passed (distinct non-null)\n" );
    }

    if( buffer1 == NULL || buffer2 == NULL )
    {
        if( verbose )
            mbedtls_printf( "  CALLOC(1): failed (NULL)\n" );
        ++failures;
    }
    else if( buffer1 == buffer2 )
    {
        if( verbose )
            mbedtls_printf( "  CALLOC(1): failed (same buffer twice)\n" );
        ++failures;
    }
    else
    {
        if( verbose )
            mbedtls_printf( "  CALLOC(1): passed\n" );
    }

    old_buffer1 = (uintptr_t) buffer1;
    mbedtls_free( buffer1 );
    buffer1 = mbedtls_calloc( 1, 1 );
    if( buffer1 == NULL )
    {
        if( verbose )
            mbedtls_printf( "  CALLOC(1 again): failed (NULL)\n" );
        ++failures;
    }
    else
    {
        if( verbose )
            mbedtls_printf( "  CALLOC(1 again): passed (%s address)\n",
                            (uintptr_t) old_buffer1 == (uintptr_t) buffer1 ?
                            "same" : "different" );
    }

    if( verbose )
        mbedtls_printf( "\n" );
    mbedtls_free( empty1 );
    mbedtls_free( empty2 );
    mbedtls_free( buffer1 );
    mbedtls_free( buffer2 );
    return( failures );
}